

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O0

void mpt::apply<mpt::point<double>,double>
               (point<double> *d,linepart *pt,double *src,point<double> *scale)

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  double dVar5;
  double s2_1;
  double s1_1;
  double s2;
  double s1;
  double part;
  double sy;
  double sx;
  size_t len;
  size_t j;
  point<double> *scale_local;
  double *src_local;
  linepart *pt_local;
  point<double> *d_local;
  
  len = 0;
  sx = (double)(ulong)pt->usr;
  dVar1 = scale->x;
  dVar2 = scale->y;
  fVar4 = linepart::cut(pt);
  dVar5 = (double)fVar4;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    if (pt->raw < 2) {
      return;
    }
    len = 1;
    dVar5 = dVar5 * (src[1] - *src) + *src;
    d->x = dVar1 * dVar5 + d->x;
    d->y = dVar2 * dVar5 + d->y;
  }
  fVar4 = linepart::trim(pt);
  dVar5 = (double)fVar4;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    if (pt->raw < 2) {
      return;
    }
    dVar3 = (double)((long)sx - 1);
    dVar5 = dVar5 * (src[(long)sx - 2] - src[(long)dVar3]) + src[(long)dVar3];
    d[(long)dVar3].x = dVar1 * dVar5 + d[(long)dVar3].x;
    d[(long)dVar3].y = dVar2 * dVar5 + d[(long)dVar3].y;
    sx = dVar3;
  }
  for (; len < (ulong)sx; len = len + 1) {
    d[len].x = dVar1 * src[len] + d[len].x;
    d[len].y = dVar2 * src[len] + d[len].y;
  }
  return;
}

Assistant:

void apply(T *d, const linepart &pt, const S *src, const T &scale)
{
	size_t j = 0, len = pt.usr;
	S sx(scale.x), sy(scale.y), part;
	
	if ((part = pt.cut())) {
		if (pt.raw < 2) {
			return;
		}
		++j;
		S s1 = src[0];
		S s2 = src[1];
		part = s1 + part * (s2 - s1);
		
		d->x += sx * part;
		d->y += sy * part;
	}
	if ((part = pt.trim())) {
		if (pt.raw < 2) {
			return;
		}
		--len;
		S s1 = src[len - 1];
		S s2 = src[len];
		part = s2 + part * (s1 - s2);
		
		d[len].x += sx * part;
		d[len].y += sy * part;
	}
	for ( ; j < len ; j++ ) {
		d[j].x += sx * src[j];
		d[j].y += sy * src[j];
	}
}